

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int closePendingFds(unixFile *pFile)

{
  unixInodeInfo *puVar1;
  UnixUnusedFd *pUVar2;
  int iVar3;
  int *piVar4;
  UnixUnusedFd *pUVar5;
  UnixUnusedFd *pChunk;
  SyMemBackend *pAlloc;
  int iVar6;
  
  puVar1 = pFile->pInode;
  pChunk = puVar1->pUnused;
  if (pChunk == (UnixUnusedFd *)0x0) {
    pUVar5 = (UnixUnusedFd *)0x0;
    iVar6 = 0;
  }
  else {
    iVar6 = 0;
    pUVar5 = (UnixUnusedFd *)0x0;
    do {
      pUVar2 = pChunk->pNext;
      iVar3 = close(pChunk->fd);
      if (iVar3 == 0) {
        SyMemBackendFree(&sUnqlMPGlobal.sAllocator,pChunk);
      }
      else {
        piVar4 = __errno_location();
        pFile->lastErrno = *piVar4;
        pChunk->pNext = pUVar5;
        iVar6 = -2;
        pUVar5 = pChunk;
      }
      pChunk = pUVar2;
    } while (pUVar2 != (UnixUnusedFd *)0x0);
  }
  puVar1->pUnused = pUVar5;
  return iVar6;
}

Assistant:

static int closePendingFds(unixFile *pFile){
  int rc = UNQLITE_OK;
  unixInodeInfo *pInode = pFile->pInode;
  UnixUnusedFd *pError = 0;
  UnixUnusedFd *p;
  UnixUnusedFd *pNext;
  for(p=pInode->pUnused; p; p=pNext){
    pNext = p->pNext;
    if( close(p->fd) ){
      pFile->lastErrno = errno;
	  rc = UNQLITE_IOERR;
      p->pNext = pError;
      pError = p;
    }else{
      unqlite_free(p);
    }
  }
  pInode->pUnused = pError;
  return rc;
}